

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_wav_get_length_in_pcm_frames(ma_wav *pWav,ma_uint64 *pLength)

{
  ma_uint64 *in_RSI;
  long in_RDI;
  ma_result wavResult;
  undefined4 local_4;
  
  if (in_RSI == (ma_uint64 *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    *in_RSI = 0;
    if (in_RDI == 0) {
      local_4 = MA_INVALID_ARGS;
    }
    else {
      local_4 = ma_dr_wav_get_length_in_pcm_frames((ma_dr_wav *)(in_RDI + 0x70),in_RSI);
      if (local_4 == MA_SUCCESS) {
        local_4 = MA_SUCCESS;
      }
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_wav_get_length_in_pcm_frames(ma_wav* pWav, ma_uint64* pLength)
{
    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;   /* Safety. */

    if (pWav == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_WAV)
    {
        ma_result wavResult = ma_dr_wav_get_length_in_pcm_frames(&pWav->dr, pLength);
        if (wavResult != MA_SUCCESS) {
            return (ma_result)wavResult;    /* ma_dr_wav result codes map to miniaudio's. */
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* wav is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}